

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_AudioDataGeneration.cpp
# Opt level: O1

Value * soul::generateWaveform
                  (Value *__return_storage_ptr__,double frequency,double sampleRate,
                  int64_t numFrames,Generator *generator,uint32_t oversamplingFactor)

{
  double dVar1;
  ChannelArrayView<const_float> source;
  ChannelArrayView<const_float> source_00;
  uint uVar2;
  Size SVar3;
  float *pfVar4;
  bool bVar5;
  undefined4 extraout_XMM0_Da;
  undefined4 extraout_XMM0_Db;
  SeparateChannelLayout<float> SVar6;
  ChannelArrayBuffer<float> data;
  ChannelArrayBuffer<float> resampledData;
  AllocatedBuffer<float,_choc::buffer::SeparateChannelLayout> local_a8;
  AllocatedBuffer<float,_choc::buffer::SeparateChannelLayout> local_88;
  double local_68;
  float **local_60;
  uint32_t uStack_58;
  undefined4 uStack_54;
  Size local_50;
  float **local_48;
  uint32_t uStack_40;
  undefined4 uStack_3c;
  Size local_38;
  
  if ((((0x14996fff < numFrames) || (sampleRate <= 0.0)) || (frequency <= 0.0)) || (numFrames < 1))
  {
    (__return_storage_ptr__->packedData).
    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    (__return_storage_ptr__->packedData).
    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    (__return_storage_ptr__->packedData).
    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    (__return_storage_ptr__->dictionary).super_StringDictionary._vptr_StringDictionary =
         (_func_int **)&PTR__SimpleStringDictionary_002d4330;
    (__return_storage_ptr__->value).type.content.object = (Object *)0x0;
    (__return_storage_ptr__->value).type.allocator = (Allocator *)0x0;
    (__return_storage_ptr__->value).data = (uint8_t *)0x0;
    (__return_storage_ptr__->dictionary).strings.super__Vector_base<char,_std::allocator<char>_>.
    _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    (__return_storage_ptr__->dictionary).strings.super__Vector_base<char,_std::allocator<char>_>.
    _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    *(undefined8 *)
     ((long)&(__return_storage_ptr__->dictionary).strings.
             super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
             _M_finish + 1) = 0;
    *(undefined8 *)
     ((long)&(__return_storage_ptr__->dictionary).strings.
             super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
             _M_end_of_storage + 1) = 0;
    (__return_storage_ptr__->value).stringDictionary =
         &(__return_storage_ptr__->dictionary).super_StringDictionary;
  }
  else {
    uVar2 = (int)numFrames * oversamplingFactor;
    SVar3 = (Size)(((ulong)uVar2 << 0x20) + 1);
    if (uVar2 == 0) {
      local_a8.view.data.channels = (float **)0x0;
      local_a8.view.data._8_8_ = 0;
    }
    else {
      local_68 = frequency;
      SVar6 = choc::buffer::SeparateChannelLayout<float>::createAllocated(SVar3);
      local_a8.view.data.channels = SVar6.channels;
      local_a8.view.data.offset = SVar6.offset;
      frequency = local_68;
    }
    local_a8.view.size = SVar3;
    if (SVar3.numChannels == 0) {
      throwInternalCompilerError("channel < size.numChannels","getIterator",0xbb);
    }
    pfVar4 = *local_a8.view.data.channels;
    generator->phaseIncrement = frequency / ((double)oversamplingFactor * sampleRate);
    local_a8.view.size.numFrames = SVar3.numFrames;
    bVar5 = local_a8.view.size.numFrames != 0;
    if (bVar5) {
      pfVar4 = pfVar4 + (local_a8.view.data._8_8_ & 0xffffffff);
      uVar2 = 0;
      do {
        (*generator->_vptr_Generator[2])(generator);
        *pfVar4 = (float)(double)CONCAT44(extraout_XMM0_Db,extraout_XMM0_Da);
        for (dVar1 = generator->phaseIncrement + generator->currentPhase; 1.0 <= dVar1;
            dVar1 = dVar1 + -1.0) {
        }
        pfVar4 = pfVar4 + 1;
        generator->currentPhase = dVar1;
        uVar2 = uVar2 + 1;
      } while (uVar2 < local_a8.view.size.numFrames);
    }
    if (oversamplingFactor == 1) {
      local_48 = local_a8.view.data.channels;
      uStack_40 = local_a8.view.data.offset;
      local_38 = local_a8.view.size;
      source.data._12_4_ = uStack_3c;
      source.data.offset = local_a8.view.data.offset;
      source.data.channels = local_a8.view.data.channels;
      source.size = local_a8.view.size;
      convertAudioDataToObject(__return_storage_ptr__,source,sampleRate);
    }
    else {
      SVar3 = (Size)((numFrames << 0x20) + 1);
      if ((int)numFrames == 0) {
        local_88.view.data.channels = (float **)0x0;
        local_88.view.data.offset = 0;
        local_88.view.data._12_4_ = 0;
      }
      else {
        SVar6 = choc::buffer::SeparateChannelLayout<float>::createAllocated(SVar3);
        local_88.view.data.channels = SVar6.channels;
        local_88.view.data.offset = SVar6.offset;
      }
      local_88.view.size = SVar3;
      resampleToFit<choc::buffer::AllocatedBuffer<float,choc::buffer::SeparateChannelLayout>&,choc::buffer::AllocatedBuffer<float,choc::buffer::SeparateChannelLayout>>
                (&local_88,&local_a8,0x32);
      local_60 = local_88.view.data.channels;
      uStack_58 = local_88.view.data.offset;
      local_50 = local_88.view.size;
      source_00.data._12_4_ = uStack_54;
      source_00.data.offset = local_88.view.data.offset;
      source_00.data.channels = local_88.view.data.channels;
      source_00.size = local_88.view.size;
      convertAudioDataToObject(__return_storage_ptr__,source_00,sampleRate);
      if ((local_88.view.data.channels != (float **)0x0) &&
         (*local_88.view.data.channels != (float *)0x0)) {
        operator_delete__(*local_88.view.data.channels);
      }
    }
    if ((local_a8.view.data.channels != (float **)0x0) &&
       (*local_a8.view.data.channels != (float *)0x0)) {
      operator_delete__(*local_a8.view.data.channels);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

choc::value::Value generateWaveform (double frequency, double sampleRate, int64_t numFrames,
                                     WaveGenerators::Generator& generator,
                                     uint32_t oversamplingFactor)
{
    if (numFrames > 0 && frequency > 0 && sampleRate > 0 && numFrames < 48000 * 60 * 60 * 2)
    {
        choc::buffer::ChannelArrayBuffer<float> data (1, (uint32_t) (numFrames * oversamplingFactor));
        auto dst = data.getIterator (0);

        generator.init (frequency, sampleRate * oversamplingFactor);

        for (uint32_t i = 0; i < data.getNumFrames(); ++i)
        {
            *dst = (float) generator.getSample();
            ++dst;
            generator.advance();
        }

        if (oversamplingFactor == 1)
            return convertAudioDataToObject (data, sampleRate);

        // Resample to the right size
        choc::buffer::ChannelArrayBuffer<float> resampledData (1, (uint32_t) numFrames);
        resampleToFit (resampledData, data);
        return convertAudioDataToObject (resampledData, sampleRate);
    }

    return {};
}